

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvec.c
# Opt level: O0

size_t bitvec_count_set(bitvec_t *vec,size_t len)

{
  uint *local_48;
  bitvec_t *v;
  size_t n;
  size_t b;
  size_t w;
  size_t bits;
  size_t words;
  size_t len_local;
  bitvec_t *vec_local;
  
  v = (bitvec_t *)0x0;
  local_48 = vec;
  for (b = 0; b < len >> 5; b = b + 1) {
    if (*local_48 != 0) {
      for (n = 0; n < 0x20; n = n + 1) {
        if ((*local_48 & 1 << ((byte)n & 0x1f)) != 0) {
          v = (bitvec_t *)((long)v + 1);
        }
      }
    }
    local_48 = local_48 + 1;
  }
  for (n = 0; n < (len & 0x1f); n = n + 1) {
    if ((*local_48 & 1 << ((byte)n & 0x1f)) != 0) {
      v = (bitvec_t *)((long)v + 1);
    }
  }
  return (size_t)v;
}

Assistant:

size_t
bitvec_count_set(bitvec_t *vec, size_t len)
{
    size_t words, bits, w, b, n;
    bitvec_t *v;

    words = len / BITVEC_BITS;
    bits = len % BITVEC_BITS;
    v = vec;
    n = 0;
    for (w = 0; w < words; ++w, ++v) {
        if (*v == 0)
            continue;
        for (b = 0; b < BITVEC_BITS; ++b)
            if (*v & (1<<b))
                ++n;
    }
    for (b = 0; b < bits; ++b)
        if (*v & (1<<b))
            ++n;

    return n;
}